

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

ValueType __thiscall Jinx::Impl::Parser::ParseValueType(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  bool local_25;
  const_iterator cStack_20;
  SymbolType type;
  Parser *local_18;
  Parser *this_local;
  
  local_25 = true;
  local_18 = this;
  if ((this->m_error & 1U) == 0) {
    cStack_20 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_25 = __gnu_cxx::operator==(&this->m_currentSymbol,&stack0xffffffffffffffe0);
  }
  if (local_25 == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    SVar1 = pSVar2->type;
    NextSymbol(this);
    switch(SVar1) {
    case Boolean:
      this_local._4_4_ = Boolean;
      break;
    default:
      Error<>(this,"Unknown type");
      this_local._4_4_ = Null;
      break;
    case Collection:
      this_local._4_4_ = Collection;
      break;
    case Coroutine:
      this_local._4_4_ = Coroutine;
      break;
    case Function:
      this_local._4_4_ = Function;
      break;
    case Guid:
      this_local._4_4_ = Guid;
      break;
    case Integer:
      this_local._4_4_ = Integer;
      break;
    case Null:
      this_local._4_4_ = Null;
      break;
    case Number:
      this_local._4_4_ = Number;
      break;
    case String:
      this_local._4_4_ = String;
    }
  }
  else {
    this_local._4_4_ = Null;
  }
  return this_local._4_4_;
}

Assistant:

inline_t ValueType Parser::ParseValueType()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return ValueType::Null;

		auto type = m_currentSymbol->type;
		NextSymbol();
		switch (type)
		{
		case SymbolType::Number:
			return ValueType::Number;
		case SymbolType::Integer:
			return ValueType::Integer;
		case SymbolType::Boolean:
			return ValueType::Boolean;
		case SymbolType::String:
			return ValueType::String;
		case SymbolType::Null:
			return ValueType::Null;
		case SymbolType::Collection:
			return ValueType::Collection;
		case SymbolType::Function:
			return ValueType::Function;
		case SymbolType::Coroutine:
			return ValueType::Coroutine;
		case SymbolType::Guid:
			return ValueType::Guid;
		default:
			Error("Unknown type");
			break;
		}
		return ValueType::Null;
	}